

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateHuffmanBlock(ucvector *out,uchar *in,size_t *bp,size_t *pos,size_t inlength,uint btype)

{
  undefined1 uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong inbitlength_00;
  ulong uVar6;
  ulong *in_RCX;
  size_t *in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  HuffmanTree *in_R8;
  int in_R9D;
  size_t length;
  size_t backward;
  size_t forward;
  size_t start;
  uint numextrabits_d;
  uint numextrabits_l;
  uint distance;
  uint code_d;
  uint code_ll;
  size_t inbitlength;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uint error;
  HuffmanTree *in_stack_ffffffffffffff48;
  HuffmanTree *in_stack_ffffffffffffff50;
  long local_a8;
  ulong local_a0;
  HuffmanTree local_70;
  uint *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  uint uVar7;
  
  uVar7 = 0;
  inbitlength_00 = (long)in_R8 << 3;
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffffb0);
  HuffmanTree_init(&local_70);
  if (in_R9D == 1) {
    getTreeInflateFixed(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else if (in_R9D == 2) {
    uVar7 = getTreeInflateDynamic
                      (in_R8,(HuffmanTree *)CONCAT44(2,uVar7),in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  }
LAB_0012286e:
  do {
    if (uVar7 != 0) {
LAB_00122c0a:
      HuffmanTree_cleanup((HuffmanTree *)0x122c14);
      HuffmanTree_cleanup((HuffmanTree *)0x122c1e);
      return uVar7;
    }
    uVar4 = huffmanDecodeSymbol(in_RSI,in_RDX,(HuffmanTree *)&stack0xffffffffffffffb0,inbitlength_00
                               );
    if (0xff < uVar4) {
      if ((uVar4 < 0x101) || (0x11d < uVar4)) {
        if ((uVar4 != 0x100) && (uVar7 = 0xb, (ulong)((long)in_R8 << 3) < *in_RDX)) {
          uVar7 = 10;
        }
        goto LAB_00122c0a;
      }
      uVar6 = (ulong)LENGTHBASE[uVar4 - 0x101];
      if (inbitlength_00 < *in_RDX + (ulong)LENGTHEXTRA[uVar4 - 0x101]) {
        uVar7 = 0x33;
        goto LAB_00122c0a;
      }
      uVar5 = readBitsFromStream(in_RDX,in_RSI,(ulong)LENGTHEXTRA[uVar4 - 0x101]);
      uVar6 = uVar5 + uVar6;
      uVar5 = huffmanDecodeSymbol(in_RSI,in_RDX,&local_70,inbitlength_00);
      if (0x1d < uVar5) {
        if (uVar4 == 0xffffffff) {
          uVar7 = 0xb;
          if ((ulong)((long)in_R8 << 3) < *in_RDX) {
            uVar7 = 10;
          }
        }
        else {
          uVar7 = 0x12;
        }
        goto LAB_00122c0a;
      }
      uVar4 = DISTANCEBASE[uVar5];
      if (inbitlength_00 < *in_RDX + (ulong)DISTANCEEXTRA[uVar5]) {
        uVar7 = 0x33;
        goto LAB_00122c0a;
      }
      uVar5 = readBitsFromStream(in_RDX,in_RSI,(ulong)DISTANCEEXTRA[uVar5]);
      uVar5 = uVar5 + uVar4;
      if (*in_RCX < (ulong)uVar5) {
        uVar7 = 0x34;
        goto LAB_00122c0a;
      }
      local_a8 = *in_RCX - (ulong)uVar5;
      uVar4 = ucvector_resize((ucvector *)in_stack_ffffffffffffff48,0x122af9);
      if (uVar4 == 0) {
        uVar7 = 0x53;
        goto LAB_00122c0a;
      }
      if (uVar5 < uVar6) {
        for (local_a0 = 0; local_a0 < uVar6; local_a0 = local_a0 + 1) {
          uVar1 = *(undefined1 *)(*in_RDI + local_a8);
          lVar2 = *in_RDI;
          uVar3 = *in_RCX;
          *in_RCX = uVar3 + 1;
          *(undefined1 *)(lVar2 + uVar3) = uVar1;
          local_a8 = local_a8 + 1;
        }
      }
      else {
        memcpy((void *)(*in_RDI + *in_RCX),(void *)(*in_RDI + local_a8),uVar6);
        *in_RCX = uVar6 + *in_RCX;
      }
      goto LAB_0012286e;
    }
    uVar5 = ucvector_resize((ucvector *)in_stack_ffffffffffffff48,0x1228cd);
    if (uVar5 == 0) {
      uVar7 = 0x53;
      goto LAB_00122c0a;
    }
    *(char *)(*in_RDI + *in_RCX) = (char)uVar4;
    *in_RCX = *in_RCX + 1;
  } while( true );
}

Assistant:

static unsigned inflateHuffmanBlock(ucvector* out, const unsigned char* in, size_t* bp,
	size_t* pos, size_t inlength, unsigned btype)
{
	unsigned error = 0;
	HuffmanTree tree_ll; /*the huffman tree for literal and length codes*/
	HuffmanTree tree_d; /*the huffman tree for distance codes*/
	size_t inbitlength = inlength * 8;

	HuffmanTree_init(&tree_ll);
	HuffmanTree_init(&tree_d);

	if (btype == 1) getTreeInflateFixed(&tree_ll, &tree_d);
	else if (btype == 2) error = getTreeInflateDynamic(&tree_ll, &tree_d, in, bp, inlength);

	while (!error) /*decode all symbols until end reached, breaks at end code*/
	{
		/*code_ll is literal, length or end code*/
		unsigned code_ll = huffmanDecodeSymbol(in, bp, &tree_ll, inbitlength);
		if (code_ll <= 255) /*literal symbol*/
		{
			/*ucvector_push_back would do the same, but for some reason the two lines below run 10% faster*/
			if (!ucvector_resize(out, (*pos) + 1)) ERROR_BREAK(83 /*alloc fail*/);
			out->data[*pos] = (unsigned char)code_ll;
			++(*pos);
		}
		else if (code_ll >= FIRST_LENGTH_CODE_INDEX && code_ll <= LAST_LENGTH_CODE_INDEX) /*length code*/
		{
			unsigned code_d, distance;
			unsigned numextrabits_l, numextrabits_d; /*extra bits for length and distance*/
			size_t start, forward, backward, length;

			/*part 1: get length base*/
			length = LENGTHBASE[code_ll - FIRST_LENGTH_CODE_INDEX];

			/*part 2: get extra bits and add the value of that to length*/
			numextrabits_l = LENGTHEXTRA[code_ll - FIRST_LENGTH_CODE_INDEX];
			if ((*bp + numextrabits_l) > inbitlength) ERROR_BREAK(51); /*error, bit pointer will jump past memory*/
			length += readBitsFromStream(bp, in, numextrabits_l);

			/*part 3: get distance code*/
			code_d = huffmanDecodeSymbol(in, bp, &tree_d, inbitlength);
			if (code_d > 29)
			{
				if (code_ll == (unsigned)(-1)) /*huffmanDecodeSymbol returns (unsigned)(-1) in case of error*/
				{
					/*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
					(10=no endcode, 11=wrong jump outside of tree)*/
					error = (*bp) > inlength * 8 ? 10 : 11;
				}
				else error = 18; /*error: invalid distance code (30-31 are never used)*/
				break;
			}
			distance = DISTANCEBASE[code_d];

			/*part 4: get extra bits from distance*/
			numextrabits_d = DISTANCEEXTRA[code_d];
			if ((*bp + numextrabits_d) > inbitlength) ERROR_BREAK(51); /*error, bit pointer will jump past memory*/
			distance += readBitsFromStream(bp, in, numextrabits_d);

			/*part 5: fill in all the out[n] values based on the length and dist*/
			start = (*pos);
			if (distance > start) ERROR_BREAK(52); /*too long backward distance*/
			backward = start - distance;

			if (!ucvector_resize(out, (*pos) + length)) ERROR_BREAK(83 /*alloc fail*/);
			if (distance < length) {
				for (forward = 0; forward < length; ++forward)
				{
					out->data[(*pos)++] = out->data[backward++];
				}
			}
			else {
				memcpy(out->data + *pos, out->data + backward, length);
				*pos += length;
			}
		}
		else if (code_ll == 256)
		{
			break; /*end code, break the loop*/
		}
		else /*if(code == (unsigned)(-1))*/ /*huffmanDecodeSymbol returns (unsigned)(-1) in case of error*/
		{
			/*return error code 10 or 11 depending on the situation that happened in huffmanDecodeSymbol
			(10=no endcode, 11=wrong jump outside of tree)*/
			error = ((*bp) > inlength * 8) ? 10 : 11;
			break;
		}
	}

	HuffmanTree_cleanup(&tree_ll);
	HuffmanTree_cleanup(&tree_d);

	return error;
}